

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall
woff2::anon_unknown_2::GlyfEncoder::WriteInstructions(GlyfEncoder *this,Glyph *glyph)

{
  woff2::Write255UShort((vector *)&this->glyph_stream_,(uint)glyph->instructions_size);
  WriteBytes(&this->instruction_stream_,glyph->instructions_data,(ulong)glyph->instructions_size);
  return;
}

Assistant:

void WriteInstructions(const Glyph& glyph) {
    Write255UShort(&glyph_stream_, glyph.instructions_size);
    WriteBytes(&instruction_stream_,
               glyph.instructions_data, glyph.instructions_size);
  }